

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O0

char * __thiscall osc::ReceivedMessageArgument::AsString(ReceivedMessageArgument *this)

{
  MissingArgumentException *this_00;
  WrongArgumentTypeException *this_01;
  ReceivedMessageArgument *this_local;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    this_00 = (MissingArgumentException *)__cxa_allocate_exception(0x10);
    MissingArgumentException::MissingArgumentException(this_00,"missing argument");
    __cxa_throw(this_00,&MissingArgumentException::typeinfo,
                MissingArgumentException::~MissingArgumentException);
  }
  if (*this->typeTagPtr_ == 's') {
    return this->argumentPtr_;
  }
  this_01 = (WrongArgumentTypeException *)__cxa_allocate_exception(0x10);
  WrongArgumentTypeException::WrongArgumentTypeException(this_01,"wrong argument type");
  __cxa_throw(this_01,&WrongArgumentTypeException::typeinfo,
              WrongArgumentTypeException::~WrongArgumentTypeException);
}

Assistant:

const char* ReceivedMessageArgument::AsString() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == STRING_TYPE_TAG )
		return argumentPtr_;
	else
		throw WrongArgumentTypeException();
}